

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O0

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenBracket(Lexer *this)

{
  Lexer *in_RSI;
  allocator<char> local_99;
  string local_98;
  Position local_78;
  undefined1 local_5a [32];
  undefined1 local_3a [30];
  undefined2 local_1c;
  char local_19;
  char c;
  Lexer *this_local;
  
  local_19 = (char)in_RSI->currentChar;
  this_local = this;
  nextChar(in_RSI);
  if (local_19 == ')') {
    local_1c = 0x12;
    getCurrentCursor((Position *)(local_3a + 2),in_RSI);
    std::make_unique<pfederc::Token,pfederc::Token*&,pfederc::TokenType,pfederc::Position>
              ((Token **)this,(TokenType *)&in_RSI->currentToken,(Position *)&local_1c);
  }
  else if (local_19 == ']') {
    local_3a._0_2_ = 0x13;
    getCurrentCursor((Position *)(local_5a + 2),in_RSI);
    std::make_unique<pfederc::Token,pfederc::Token*&,pfederc::TokenType,pfederc::Position>
              ((Token **)this,(TokenType *)&in_RSI->currentToken,(Position *)local_3a);
  }
  else if (local_19 == '}') {
    local_5a._0_2_ = 0x14;
    getCurrentCursor(&local_78,in_RSI);
    std::make_unique<pfederc::Token,pfederc::Token*&,pfederc::TokenType,pfederc::Position>
              ((Token **)this,(TokenType *)&in_RSI->currentToken,(Position *)local_5a);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"Unexpected branch reached",&local_99);
    fatal("/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_lexer/src/lexer_next.cpp"
          ,0x232,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    std::unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>>::
    unique_ptr<std::default_delete<pfederc::Token>,void>
              ((unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>> *)this,(nullptr_t)0x0
              );
  }
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenBracket() noexcept {
  const char c = currentChar;
  nextChar(); // eat bracket
  switch (c) {
  case ')':
    return std::make_unique<Token>(currentToken, TokenType::TOK_BRACKET_CLOSE, getCurrentCursor());
  case ']':
    return std::make_unique<Token>(currentToken, TokenType::TOK_ARR_BRACKET_CLOSE, getCurrentCursor());
  case '}':
    return std::make_unique<Token>(currentToken, TokenType::TOK_TEMPL_BRACKET_CLOSE, getCurrentCursor());
  default:
    fatal(__FILE__, __LINE__, "Unexpected branch reached");
    return nullptr;
  }
}